

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Nsf_Emu.cpp
# Opt level: O0

void __thiscall Nsf_Emu::cpu_write_misc(Nsf_Emu *this,nes_addr_t addr,int data)

{
  int in_EDX;
  uint uVar1;
  time_t *in_RSI;
  long in_RDI;
  uint osc;
  uint reg;
  undefined8 in_stack_ffffffffffffffb8;
  undefined8 in_stack_ffffffffffffffc0;
  Nes_Fme7_Apu *this_00;
  int in_stack_ffffffffffffffc8;
  uint in_stack_ffffffffffffffcc;
  Nes_Vrc6_Apu *in_stack_ffffffffffffffd0;
  Nes_Namco_Apu *this_01;
  
  uVar1 = (uint)in_RSI;
  if (*(long *)(in_RDI + 0xb58) != 0) {
    if (uVar1 == 0x4800) {
      this_01 = *(Nes_Namco_Apu **)(in_RDI + 0xb58);
      Nes_Cpu::time((Nes_Cpu *)(in_RDI + 0x1c8),in_RSI);
      Nes_Namco_Apu::write_data(this_01,in_stack_ffffffffffffffcc,in_stack_ffffffffffffffc8);
      return;
    }
    if (uVar1 == 0xf800) {
      Nes_Namco_Apu::write_addr(*(Nes_Namco_Apu **)(in_RDI + 0xb58),in_EDX);
      return;
    }
  }
  if ((0xbfff < uVar1) && (*(long *)(in_RDI + 0xb68) != 0)) {
    in_stack_ffffffffffffffcc = uVar1 & 0xe000;
    if (in_stack_ffffffffffffffcc == 0xc000) {
      Nes_Fme7_Apu::write_latch(*(Nes_Fme7_Apu **)(in_RDI + 0xb68),in_EDX);
      return;
    }
    if (in_stack_ffffffffffffffcc == 0xe000) {
      this_00 = *(Nes_Fme7_Apu **)(in_RDI + 0xb68);
      Nes_Cpu::time((Nes_Cpu *)(in_RDI + 0x1c8),in_RSI);
      Nes_Fme7_Apu::write_data
                (this_00,(blip_time_t)((ulong)in_stack_ffffffffffffffb8 >> 0x20),
                 (int)in_stack_ffffffffffffffb8);
      return;
    }
  }
  if (((*(long *)(in_RDI + 0xb60) != 0) && (uVar1 - 0x9000 >> 0xc < 3)) && ((uVar1 & 0xfff) < 3)) {
    Nes_Cpu::time((Nes_Cpu *)(in_RDI + 0x1c8),in_RSI);
    Nes_Vrc6_Apu::write_osc
              (in_stack_ffffffffffffffd0,in_stack_ffffffffffffffcc,in_stack_ffffffffffffffc8,
               (int)((ulong)in_stack_ffffffffffffffc0 >> 0x20),(int)in_stack_ffffffffffffffc0);
  }
  return;
}

Assistant:

void Nsf_Emu::cpu_write_misc( nes_addr_t addr, int data )
{
	#if !NSF_EMU_APU_ONLY
	{
		if ( namco )
		{
			switch ( addr )
			{
			case Nes_Namco_Apu::data_reg_addr:
				namco->write_data( time(), data );
				return;
			
			case Nes_Namco_Apu::addr_reg_addr:
				namco->write_addr( data );
				return;
			}
		}
		
		if ( addr >= Nes_Fme7_Apu::latch_addr && fme7 )
		{
			switch ( addr & Nes_Fme7_Apu::addr_mask )
			{
			case Nes_Fme7_Apu::latch_addr:
				fme7->write_latch( data );
				return;
			
			case Nes_Fme7_Apu::data_addr:
				fme7->write_data( time(), data );
				return;
			}
		}
		
		if ( vrc6 )
		{
			unsigned reg = addr & (Nes_Vrc6_Apu::addr_step - 1);
			unsigned osc = unsigned (addr - Nes_Vrc6_Apu::base_addr) / Nes_Vrc6_Apu::addr_step;
			if ( osc < Nes_Vrc6_Apu::osc_count && reg < Nes_Vrc6_Apu::reg_count )
			{
				vrc6->write_osc( time(), osc, reg, data );
				return;
			}
		}
	}
	#endif
	
	// unmapped write
	
	#ifndef NDEBUG
	{
		// some games write to $8000 and $8001 repeatedly
		if ( addr == 0x8000 || addr == 0x8001 ) return;
		
		// probably namco sound mistakenly turned on in mck
		if ( addr == 0x4800 || addr == 0xF800 ) return;
		
		// memory mapper?
		if ( addr == 0xFFF8 ) return;
		
		debug_printf( "write_unmapped( 0x%04X, 0x%02X )\n", (unsigned) addr, (unsigned) data );
	}
	#endif
}